

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O0

void __thiscall
BayesianGameWithClusterInfo::BayesianGameWithClusterInfo
          (BayesianGameWithClusterInfo *this,BayesianGameWithClusterInfo *o)

{
  TypeCluster *o_00;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *this_00;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *pvVar1;
  value_type pvVar2;
  reference ppvVar3;
  ulong uVar4;
  const_reference ppvVar5;
  size_type sVar6;
  value_type pTVar7;
  long in_RSI;
  BayesianGameForDecPOMDPStage *in_RDI;
  Index j;
  Index k;
  reference in_stack_ffffffffffffff18;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *in_stack_ffffffffffffff20;
  shared_ptr<const_BayesianGameWithClusterInfo> *in_stack_ffffffffffffff28;
  shared_ptr<const_BayesianGameWithClusterInfo> *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  *in_stack_ffffffffffffff40;
  TypeCluster *this_01;
  BayesianGameForDecPOMDPStage *in_stack_ffffffffffffff98;
  uint local_4c;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar8;
  undefined4 in_stack_ffffffffffffffbc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc0;
  
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage(in_RDI,in_stack_ffffffffffffff98);
  (in_RDI->super_BayesianGameForDecPOMDPStageInterface)._vptr_BayesianGameForDecPOMDPStageInterface
       = (_func_int **)&PTR__BayesianGameWithClusterInfo_00d06ad0;
  (in_RDI->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
  super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__BayesianGameWithClusterInfo_00d06b20;
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8bba96);
  boost::shared_ptr<const_JointPolicyDiscretePure>::shared_ptr
            ((shared_ptr<const_JointPolicyDiscretePure> *)0x8bbab2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8bbace);
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::vector((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            *)0x8bbae7);
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  in_RDI[1].super_BayesianGameForDecPOMDPStageInterface._m_pJPol.px =
       *(element_type **)(in_RSI + 0x160);
  in_RDI[1].super_BayesianGameForDecPOMDPStageInterface._m_pJPol.pn.pi_ =
       *(sp_counted_base **)(in_RSI + 0x168);
  boost::shared_ptr<const_JointPolicyDiscretePure>::operator=
            ((shared_ptr<const_JointPolicyDiscretePure> *)in_stack_ffffffffffffff30,
             (shared_ptr<const_JointPolicyDiscretePure> *)in_stack_ffffffffffffff28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_ffffffffffffffc0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  *(undefined4 *)
   ((long)&in_RDI[1].super_BayesianGameIdenticalPayoff.super_BayesianGameIdenticalPayoffInterface.
           super_BayesianGameBase._m_jTypeProbsSparse.data_.
           super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ._M_t + 0x10) = *(undefined4 *)(in_RSI + 0x1b0);
  *(_Base_ptr *)
   ((long)&in_RDI[1].super_BayesianGameIdenticalPayoff.super_BayesianGameIdenticalPayoffInterface.
           super_BayesianGameBase._m_jTypeProbsSparse.data_.
           super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ._M_t + 0x18) = *(_Base_ptr *)(in_RSI + 0x1b8);
  *(_Base_ptr *)
   ((long)&in_RDI[1].super_BayesianGameIdenticalPayoff.super_BayesianGameIdenticalPayoffInterface.
           super_BayesianGameBase._m_jTypeProbsSparse.data_.
           super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ._M_t + 0x20) = *(_Base_ptr *)(in_RSI + 0x1c0);
  o_00 = (TypeCluster *)
         std::
         vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
         ::size((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 *)(in_RSI + 0x198));
  this_01 = (TypeCluster *)&stack0xffffffffffffffbf;
  std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>::allocator
            ((allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*> *)0x8bbbf1);
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::vector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
           (value_type *)in_stack_ffffffffffffff30,(allocator_type *)in_stack_ffffffffffffff28);
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::operator=((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
               *)in_stack_ffffffffffffff30,
              (vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
               *)in_stack_ffffffffffffff28);
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::~vector((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
             *)in_stack_ffffffffffffff30);
  std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>::~allocator
            ((allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*> *)0x8bbc48);
  uVar8 = 0;
  while( true ) {
    this_00 = (vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)(ulong)uVar8;
    pvVar1 = (vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)
             std::
             vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
             ::size((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                     *)(in_RSI + 0x198));
    if (this_00 == pvVar1) break;
    pvVar1 = (vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)
             std::
             vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
             ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                   *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
    if ((value_type)
        (pvVar1->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
        super__Vector_impl_data._M_start != (value_type)0x0) {
      pvVar2 = (value_type)operator_new(0x18);
      std::
      vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
      ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
      std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::vector(this_00,pvVar1);
      ppvVar3 = std::
                vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                      *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
      *ppvVar3 = pvVar2;
      local_4c = 0;
      while( true ) {
        uVar4 = (ulong)local_4c;
        ppvVar5 = std::
                  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                  ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                        *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
        sVar6 = std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::size(*ppvVar5);
        if (uVar4 == sVar6) break;
        pTVar7 = (value_type)operator_new(0x38);
        std::
        vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
        ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
              *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
        std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::at
                  (in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
        TypeCluster::TypeCluster(this_01,o_00);
        in_stack_ffffffffffffff20 =
             (vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)
             std::
             vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
             ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                   *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
        in_stack_ffffffffffffff18 =
             std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::at
                       (in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
        *in_stack_ffffffffffffff18 = pTVar7;
        local_4c = local_4c + 1;
      }
    }
    uVar8 = uVar8 + 1;
  }
  return;
}

Assistant:

BayesianGameWithClusterInfo::BayesianGameWithClusterInfo(const BayesianGameWithClusterInfo& o) :
        BayesianGameForDecPOMDPStage( o )
{
    _m_pBG = o._m_pBG;
    _m_qJB = o._m_qJB;
    _m_qHybrid = o._m_qHybrid;
    _m_pBGJPol = o._m_pBGJPol;
    _m_jaohReps = o._m_jaohReps;
    _m_clusterAlgorithm = o._m_clusterAlgorithm;
    _m_thresholdJB = o._m_thresholdJB;
    _m_thresholdPjaoh = o._m_thresholdPjaoh;
    _m_typeLists= std::vector< TypeClusterList* > (o._m_typeLists.size(),0);
    for(Index k=0;k!=o._m_typeLists.size();++k)
    {
        if(o._m_typeLists.at(k))
        {
            _m_typeLists.at(k)=new TypeClusterList(*o._m_typeLists.at(k));
            for(Index j=0;j!=o._m_typeLists.at(k)->size();++j)
                _m_typeLists.at(k)->at(j)=new TypeCluster(*o._m_typeLists.at(k)->at(j));
        }
    }
}